

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InlinePass::FixDebugDeclare
          (InlinePass *this,Instruction *dbg_declare_inst,
          map<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *access_chains)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  Instruction *this_00;
  _Rb_tree_color _Var3;
  const_iterator __cbeg;
  Operand *pOVar4;
  pointer pOVar5;
  char cVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  uint uVar10;
  int i;
  uint32_t uVar11;
  bool bVar12;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  uVar10 = (dbg_declare_inst->has_result_id_ & 1) + 1;
  if (dbg_declare_inst->has_type_id_ == false) {
    uVar10 = (uint)dbg_declare_inst->has_result_id_;
  }
  _Var3 = Instruction::GetSingleWordOperand(dbg_declare_inst,uVar10 + 3);
  p_Var7 = (access_chains->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(access_chains->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      do {
        bVar12 = p_Var7[1]._M_color < _Var3;
        if (!bVar12) {
          p_Var8 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar12];
      } while (p_Var7 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
        return;
      }
      if (_Var3 < p_Var8[1]._M_color) {
        return;
      }
      this_00 = (Instruction *)p_Var8[1]._M_parent;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar11 = 0;
      do {
        pOVar4 = Instruction::GetInOperand(dbg_declare_inst,uVar11);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&local_48,pOVar4);
        uVar11 = uVar11 + 1;
      } while (uVar11 != 3);
      uVar11 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar11 = (uint)this_00->has_result_id_;
      }
      local_a0._16_4_ = Instruction::GetSingleWordOperand(this_00,uVar11);
      local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
      local_a0._24_8_ = local_a0 + 0x10;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._8_8_ = 1;
      local_78._0_4_ = SPV_OPERAND_TYPE_ID;
      local_78._8_8_ = &PTR__SmallVector_00b02ef8;
      local_78._16_8_ = 0;
      local_78._32_8_ = local_78 + 0x18;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_a0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
      local_78._8_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      pOVar4 = Instruction::GetInOperand(dbg_declare_inst,4);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&local_48,pOVar4);
      uVar10 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar10 = (uint)this_00->has_result_id_;
      }
      if (1 < (int)((ulong)((long)(this_00->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar10) {
        uVar11 = 1;
        do {
          pOVar4 = Instruction::GetInOperand(this_00,uVar11);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_48,pOVar4);
          uVar11 = uVar11 + 1;
          uVar10 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar10 = (uint)this_00->has_result_id_;
          }
        } while (uVar11 < (int)((ulong)((long)(this_00->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this_00->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555 - uVar10);
      }
      pOVar5 = (dbg_declare_inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)(dbg_declare_inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5;
      cVar6 = dbg_declare_inst->has_type_id_;
      bVar2 = dbg_declare_inst->has_result_id_;
      uVar10 = (bVar2 & 1) + 1;
      if ((bool)cVar6 == false) {
        uVar10 = (uint)bVar2;
      }
      if (5 < (int)(uVar9 >> 4) * -0x55555555 - uVar10) {
        uVar11 = 5;
        do {
          pOVar4 = Instruction::GetInOperand(dbg_declare_inst,uVar11);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_48,pOVar4);
          uVar11 = uVar11 + 1;
          pOVar5 = (dbg_declare_inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = (long)(dbg_declare_inst->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5;
          cVar6 = dbg_declare_inst->has_type_id_;
          bVar2 = dbg_declare_inst->has_result_id_;
          uVar10 = (bVar2 & 1) + 1;
          if ((bool)cVar6 == false) {
            uVar10 = (uint)bVar2;
          }
        } while (uVar11 < (int)(uVar9 >> 4) * -0x55555555 - uVar10);
      }
      uVar10 = (bVar2 & 1) + 1;
      if (cVar6 == '\0') {
        uVar10 = (uint)bVar2;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&dbg_declare_inst->operands_,
                 (Operand *)
                 ((long)((pOVar5->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar10 * 0x30)),
                 (Operand *)((long)((pOVar5->words).buffer + 0xfffffffffffffffa) + uVar9));
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &dbg_declare_inst->operands_,
                 (dbg_declare_inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_48);
      uVar10 = (dbg_declare_inst->has_result_id_ & 1) + 1;
      if (dbg_declare_inst->has_type_id_ == false) {
        uVar10 = (uint)dbg_declare_inst->has_result_id_;
      }
      _Var3 = Instruction::GetSingleWordOperand(dbg_declare_inst,uVar10 + 3);
      p_Var7 = (access_chains->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var1->_M_header;
    } while (p_Var7 != (_Base_ptr)0x0);
  }
  return;
}

Assistant:

void InlinePass::FixDebugDeclare(
    Instruction* dbg_declare_inst,
    const std::map<uint32_t, Instruction*>& access_chains) {
  do {
    uint32_t var_id =
        dbg_declare_inst->GetSingleWordInOperand(kSpvDebugDeclareVarInIdx);

    // The def-use chains are not kept up to date while inlining, so we need to
    // get the variable by traversing the functions.
    auto it = access_chains.find(var_id);
    if (it == access_chains.end()) {
      return;
    }
    Instruction* access_chain = it->second;

    // If the variable id in the debug declare is an access chain, it is
    // invalid. it needs to be fixed up. The debug declare will be updated so
    // that its Var operand becomes the base of the access chain. The indexes of
    // the access chain are prepended before the indexes of the debug declare.

    std::vector<Operand> operands;
    for (int i = 0; i < kSpvDebugDeclareVarInIdx; i++) {
      operands.push_back(dbg_declare_inst->GetInOperand(i));
    }

    uint32_t access_chain_base =
        access_chain->GetSingleWordInOperand(kSpvAccessChainBaseInIdx);
    operands.push_back(Operand(SPV_OPERAND_TYPE_ID, {access_chain_base}));
    operands.push_back(
        dbg_declare_inst->GetInOperand(kSpvDebugDeclareVarInIdx + 1));

    for (uint32_t i = kSpvAccessChainBaseInIdx + 1;
         i < access_chain->NumInOperands(); ++i) {
      operands.push_back(access_chain->GetInOperand(i));
    }

    for (uint32_t i = kSpvDebugDeclareVarInIdx + 2;
         i < dbg_declare_inst->NumInOperands(); ++i) {
      operands.push_back(dbg_declare_inst->GetInOperand(i));
    }

    dbg_declare_inst->SetInOperands(std::move(operands));
  } while (true);
}